

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O1

void copy_cursor(int newx,int newy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  sbyte sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint *local_60;
  uint *local_58;
  
  uVar4 = displaywidth;
  iVar3 = LastCursorClippingX;
  uVar12 = displaywidth + 0xf;
  if (-1 < (int)displaywidth) {
    uVar12 = displaywidth;
  }
  if (newx < 0) {
    uVar8 = -(ulong)(7U - newx >> 3);
  }
  else {
    uVar8 = (ulong)((uint)newx >> 3);
  }
  uVar8 = (long)DisplayRegion68k + uVar8 + (long)(((int)uVar12 >> 4) * newy) * 2;
  if (0 < LastCursorClippingY) {
    local_58 = (uint *)((ulong)EmCursorBitMap68K & 0xfffffffffffffffc);
    uVar9 = (int)EmCursorBitMap68K * 8;
    uVar12 = (newx & 7U) + ((uint)uVar8 & 3) * 8;
    iVar5 = uVar12 + (int)EmCursorBitMap68K * -8;
    uVar14 = uVar9 & 0x18;
    uVar10 = uVar9 - uVar12 & 0x1f;
    uVar18 = 0;
    uVar15 = -(uint)(uVar10 == 0) | ~(-1 << (sbyte)uVar10);
    uVar19 = (LastCursorClippingX + uVar12) - 1 & 0x1f;
    uVar20 = -1 << (~(byte)uVar19 & 0x1f);
    uVar16 = -(uint)(uVar12 == 0) | -1 << (-(char)uVar12 & 0x1fU) ^ 0xffffffffU;
    uVar11 = uVar20 & uVar16;
    local_60 = (uint *)(uVar8 & 0xfffffffffffffffc);
    iVar2 = LastCursorClippingY;
    do {
      bVar6 = (byte)iVar5 & 0x1f;
      sVar7 = (sbyte)uVar10;
      if (uVar12 < uVar14) {
        if (0x20 < (int)(iVar3 + uVar14)) {
          uVar18 = local_58[1];
          puVar13 = local_58 + 2;
          uVar10 = uVar18 >> bVar6 & uVar15 | *local_58 << sVar7;
          goto LAB_001296a4;
        }
        if (uVar14 <= uVar12) goto LAB_00129688;
        puVar13 = local_58 + 1;
        uVar10 = *local_58 << sVar7;
      }
      else {
LAB_00129688:
        puVar13 = local_58 + 1;
        uVar18 = *local_58;
        uVar10 = uVar18 >> bVar6 & uVar15;
LAB_001296a4:
        uVar18 = ~uVar15 & uVar18 << sVar7;
      }
      puVar17 = local_60;
      if ((int)(iVar3 + uVar12) < 0x21) {
LAB_001296c7:
        uVar9 = *puVar17;
        *puVar17 = ((uVar10 | uVar9) ^ uVar9) & uVar11 ^ uVar9;
      }
      else {
        iVar5 = (int)(uVar12 + iVar3) >> 5;
        uVar11 = *local_60;
        *local_60 = ((uVar10 | uVar11) ^ uVar11) & uVar16 ^ uVar11;
        puVar17 = local_60 + 1;
        if (uVar14 == uVar12) {
          for (; 1 < iVar5; iVar5 = iVar5 + -1) {
            *puVar17 = *puVar17 | *puVar13;
            puVar13 = puVar13 + 1;
            puVar17 = puVar17 + 1;
          }
        }
        else {
          for (; 1 < iVar5; iVar5 = iVar5 + -1) {
            uVar11 = *puVar13;
            puVar13 = puVar13 + 1;
            *puVar17 = uVar18 | *puVar17 | uVar11 >> bVar6;
            puVar17 = puVar17 + 1;
            uVar18 = uVar11 << sVar7;
          }
        }
        if (uVar19 != 0x1f) {
          uVar11 = uVar20;
          uVar10 = uVar18;
          if (((iVar3 + uVar9) - 1 & 0x1f) <= uVar19) {
            uVar10 = *puVar13 >> bVar6 & uVar15 | uVar18;
          }
          goto LAB_001296c7;
        }
      }
      uVar10 = uVar12 + uVar4;
      local_60 = local_60 + ((int)uVar10 >> 5);
      uVar12 = uVar10 & 0x1f;
      uVar19 = (uVar12 + iVar3) - 1 & 0x1f;
      uVar16 = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
      uVar20 = -1 << (~(byte)uVar19 & 0x1f);
      uVar11 = uVar20 & uVar16;
      uVar9 = uVar14 + 0x10;
      iVar5 = uVar12 - uVar9;
      uVar10 = uVar9 - uVar10 & 0x1f;
      local_58 = local_58 + (uVar9 >> 5);
      uVar14 = uVar9 & 0x1f;
      uVar15 = -(uint)(uVar10 == 0) | ~(-1 << (sbyte)uVar10);
      bVar1 = 1 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void copy_cursor(int newx, int newy)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  extern DLword *EmCursorBitMap68K;
  /* copy cursor image */
  srcbase = EmCursorBitMap68K;
  dstbase = DisplayRegion68k + (newy * DLWORD_PERLINE);
  sx = 0;
  dx = newx;
  w = LastCursorClippingX;
  h = LastCursorClippingY;

  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 2; /* OR-in */
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, newy, w, h);
#endif
}